

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O1

bool __thiscall basisu::basisu_frontend::compress(basisu_frontend *this)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  uint uVar6;
  char buf [256];
  char acStack_138 [264];
  
  debug_printf("basisu_frontend::compress\n");
  uVar3 = (this->m_params).m_num_source_blocks;
  this->m_total_blocks = uVar3;
  this->m_total_pixels = uVar3 << 4;
  init_etc1_images(this);
  if ((this->m_params).m_pGlobal_codebooks == (basisu_lowlevel_etc1s_transcoder *)0x0) {
    init_endpoint_training_vectors(this);
    generate_endpoint_clusters(this);
    if (this->m_num_endpoint_codebook_iterations != 0) {
      uVar6 = 0;
      do {
        if ((this->m_params).m_validate == true) {
          bVar2 = check_etc1s_constraints(this);
          if (!bVar2) {
            uVar5 = 0xba;
            goto LAB_0022f7d3;
          }
          bVar2 = validate_endpoint_cluster_hierarchy(this,false);
          if (!bVar2) {
            uVar5 = 0xbc;
            goto LAB_0022f7d3;
          }
        }
        if (uVar6 != 0) {
          introduce_new_endpoint_clusters(this);
        }
        if (((this->m_params).m_validate == true) &&
           (bVar2 = validate_endpoint_cluster_hierarchy(this,false), !bVar2)) {
          uVar5 = 0xc6;
          goto LAB_0022f7d3;
        }
        generate_endpoint_codebook(this,uVar6);
        if (((this->m_params).m_debug_images == true) &&
           ((this->m_params).m_dump_endpoint_clusterization == true)) {
          snprintf(acStack_138,0x100,"endpoint_cluster_vis_pre_%u.png",(ulong)uVar6);
          dump_endpoint_clusterization_visualization(this,acStack_138,false);
        }
        if (this->m_endpoint_refinement == true) {
          uVar3 = refine_endpoint_clusterization(this);
          bVar2 = uVar3 == 0;
          if (((uVar6 == 0) && ((this->m_params).m_tex_type == cBASISTexTypeVideoFrames)) &&
             (this->m_num_endpoint_codebook_iterations == 1)) {
            eliminate_redundant_or_empty_endpoint_clusters(this);
            generate_endpoint_codebook(this,1);
          }
          if (((this->m_params).m_debug_images == true) &&
             ((this->m_params).m_dump_endpoint_clusterization == true)) {
            snprintf(acStack_138,0x100,"endpoint_cluster_vis_post_%u.png",(ulong)uVar6);
            dump_endpoint_clusterization_visualization(this,acStack_138,false);
            snprintf(acStack_138,0x100,"endpoint_cluster_colors_vis_post_%u.png",(ulong)uVar6);
            dump_endpoint_clusterization_visualization(this,acStack_138,true);
          }
        }
        else {
          bVar2 = false;
        }
        if (((this->m_params).m_validate == true) &&
           (bVar1 = validate_endpoint_cluster_hierarchy(this,false), !bVar1)) {
          uVar5 = 0xef;
          goto LAB_0022f7d3;
        }
        eliminate_redundant_or_empty_endpoint_clusters(this);
        if (((this->m_params).m_validate == true) &&
           (bVar1 = validate_endpoint_cluster_hierarchy(this,false), !bVar1)) {
          uVar5 = 0xf6;
          goto LAB_0022f7d3;
        }
        if ((this->m_params).m_debug_stats == true) {
          debug_printf("Total endpoint clusters: %u\n");
        }
      } while ((!bVar2) && (uVar6 = uVar6 + 1, uVar6 < this->m_num_endpoint_codebook_iterations));
    }
    if (((this->m_params).m_validate == true) && (bVar2 = check_etc1s_constraints(this), !bVar2)) {
      uVar5 = 0x102;
LAB_0022f7d3:
      error_printf("basisu_frontend: verify check failed at line %i!\n",uVar5);
      abort();
    }
    generate_block_endpoint_clusters(this);
    create_initial_packed_texture(this);
    generate_selector_clusters(this);
    if (this->m_use_hierarchical_selector_codebooks == true) {
      compute_selector_clusters_within_each_parent_cluster(this);
    }
    if ((this->m_params).m_compression_level == 0) {
      create_optimized_selector_codebook(this,0);
      find_optimal_selector_clusters_for_each_block(this);
      introduce_special_selector_clusters(this);
    }
    else {
      uVar6 = this->m_num_selector_codebook_iterations;
      if (uVar6 != 0) {
        uVar3 = 0;
        do {
          create_optimized_selector_codebook(this,uVar3);
          find_optimal_selector_clusters_for_each_block(this);
          introduce_special_selector_clusters(this);
          if (((3 < (this->m_params).m_compression_level) ||
              ((this->m_params).m_tex_type == cBASISTexTypeVideoFrames)) &&
             (uVar4 = refine_block_endpoints_given_selectors(this), uVar4 == 0)) break;
          uVar3 = uVar3 + 1;
        } while (uVar3 < uVar6);
      }
    }
    optimize_selector_codebook(this);
    if ((this->m_params).m_debug_stats == true) {
      debug_printf("Total selector clusters: %u\n",
                   (ulong)(this->m_selector_cluster_block_indices).m_size);
    }
  }
  else {
    init_global_codebooks(this);
  }
  finalize(this);
  if (((this->m_params).m_validate != true) || (bVar2 = validate_output(this), bVar2)) {
    debug_printf("basisu_frontend::compress: Done\n");
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool basisu_frontend::compress()
	{
		debug_printf("basisu_frontend::compress\n");

		m_total_blocks = m_params.m_num_source_blocks;
		m_total_pixels = m_total_blocks * cPixelBlockTotalPixels;

		// Encode the initial high quality ETC1S texture

		init_etc1_images();

		// First quantize the ETC1S endpoints

		if (m_params.m_pGlobal_codebooks)
		{
			init_global_codebooks();
		}
		else
		{
			init_endpoint_training_vectors();

			generate_endpoint_clusters();

			for (uint32_t refine_endpoint_step = 0; refine_endpoint_step < m_num_endpoint_codebook_iterations; refine_endpoint_step++)
			{
				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(check_etc1s_constraints());

					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}

				if (refine_endpoint_step)
				{
					introduce_new_endpoint_clusters();
				}

				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}

				generate_endpoint_codebook(refine_endpoint_step);

				if ((m_params.m_debug_images) && (m_params.m_dump_endpoint_clusterization))
				{
					char buf[256];
					snprintf(buf, sizeof(buf), "endpoint_cluster_vis_pre_%u.png", refine_endpoint_step);
					dump_endpoint_clusterization_visualization(buf, false);
				}

				bool early_out = false;

				if (m_endpoint_refinement)
				{
					//dump_endpoint_clusterization_visualization("endpoint_clusters_before_refinement.png");

					if (!refine_endpoint_clusterization())
						early_out = true;

					if ((m_params.m_tex_type == basist::cBASISTexTypeVideoFrames) && (!refine_endpoint_step) && (m_num_endpoint_codebook_iterations == 1))
					{
						eliminate_redundant_or_empty_endpoint_clusters();
						generate_endpoint_codebook(basisu::maximum(1U, refine_endpoint_step));
					}

					if ((m_params.m_debug_images) && (m_params.m_dump_endpoint_clusterization))
					{
						char buf[256];
						snprintf(buf, sizeof(buf), "endpoint_cluster_vis_post_%u.png", refine_endpoint_step);

						dump_endpoint_clusterization_visualization(buf, false);
						snprintf(buf, sizeof(buf), "endpoint_cluster_colors_vis_post_%u.png", refine_endpoint_step);

						dump_endpoint_clusterization_visualization(buf, true);
					}
				}

				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}
						
				eliminate_redundant_or_empty_endpoint_clusters();

				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}

				if (m_params.m_debug_stats)
					debug_printf("Total endpoint clusters: %u\n", (uint32_t)m_endpoint_clusters.size());

				if (early_out)
					break;
			}
			
			if (m_params.m_validate)
			{
				BASISU_FRONTEND_VERIFY(check_etc1s_constraints());
			}

			generate_block_endpoint_clusters();

			create_initial_packed_texture();

			// Now quantize the ETC1S selectors

			generate_selector_clusters();

			if (m_use_hierarchical_selector_codebooks)
				compute_selector_clusters_within_each_parent_cluster();
				
			if (m_params.m_compression_level == 0)
			{
				create_optimized_selector_codebook(0);

				find_optimal_selector_clusters_for_each_block();
							
				introduce_special_selector_clusters();
			}
			else
			{
				const uint32_t num_refine_selector_steps = m_num_selector_codebook_iterations;
				for (uint32_t refine_selector_steps = 0; refine_selector_steps < num_refine_selector_steps; refine_selector_steps++)
				{
					create_optimized_selector_codebook(refine_selector_steps);

					find_optimal_selector_clusters_for_each_block();

					introduce_special_selector_clusters();

					if ((m_params.m_compression_level >= 4) || (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames))
					{
						if (!refine_block_endpoints_given_selectors())
							break;
					}
				}
			}
				
			optimize_selector_codebook();

			if (m_params.m_debug_stats)
				debug_printf("Total selector clusters: %u\n", (uint32_t)m_selector_cluster_block_indices.size());
		}

		finalize();

		if (m_params.m_validate)
		{
			if (!validate_output())
				return false;
		}

		debug_printf("basisu_frontend::compress: Done\n");

		return true;
	}